

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

Vertex * __thiscall MeshLib::Solid::edgeSplit(Solid *this,Edge *e)

{
  int iVar1;
  HalfEdge *pHVar2;
  Edge *pEVar3;
  HalfEdge *pHVar4;
  Node<MeshLib::Vertex> *pNVar5;
  bool bVar6;
  Vertex *pVVar7;
  tVertex this_00;
  HalfEdge **ppHVar8;
  bool *pbVar9;
  Face **ppFVar10;
  Vertex **ppVVar11;
  Edge **ppEVar12;
  int *piVar13;
  Face *pFVar14;
  int local_3b4;
  int local_37c;
  HalfEdge *h;
  Edge *e_1;
  HalfEdge *he_1;
  Face *f_1;
  ListIterator<MeshLib::Face> iter;
  Face *nf;
  tVertex w [3];
  int local_2f4 [2];
  int vid [3];
  tHalfEdge ne;
  int k;
  tEdge te;
  int i;
  tFace f;
  tHalfEdge he;
  tVertex v [3];
  undefined1 local_298 [4];
  int j;
  List<MeshLib::Face> new_faces;
  tHalfEdge hes [2];
  tVertex nv;
  undefined1 local_260 [4];
  int max_fid;
  TreeIterator<MeshLib::Face> fiter;
  int local_134;
  undefined1 local_130 [4];
  int max_vid;
  TreeIterator<MeshLib::Vertex> viter;
  Edge *e_local;
  Solid *this_local;
  
  viter.m_root = (Node<MeshLib::Vertex> *)e;
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator
            ((TreeIterator<MeshLib::Vertex> *)local_130,&this->m_verts);
  local_134 = -1;
  while (bVar6 = AVL::TreeIterator<MeshLib::Vertex>::end((TreeIterator<MeshLib::Vertex> *)local_130)
        , ((bVar6 ^ 0xffU) & 1) != 0) {
    pVVar7 = AVL::TreeIterator<MeshLib::Vertex>::operator*
                       ((TreeIterator<MeshLib::Vertex> *)local_130);
    piVar13 = Vertex::id(pVVar7);
    if (*piVar13 < local_134) {
      local_37c = local_134;
    }
    else {
      pVVar7 = AVL::TreeIterator<MeshLib::Vertex>::operator*
                         ((TreeIterator<MeshLib::Vertex> *)local_130);
      piVar13 = Vertex::id(pVVar7);
      local_37c = *piVar13;
    }
    local_134 = local_37c;
    AVL::TreeIterator<MeshLib::Vertex>::operator++((TreeIterator<MeshLib::Vertex> *)local_130);
  }
  AVL::TreeIterator<MeshLib::Face>::TreeIterator
            ((TreeIterator<MeshLib::Face> *)local_260,&this->m_faces);
  nv._4_4_ = -1;
  while (bVar6 = AVL::TreeIterator<MeshLib::Face>::end((TreeIterator<MeshLib::Face> *)local_260),
        ((bVar6 ^ 0xffU) & 1) != 0) {
    pFVar14 = AVL::TreeIterator<MeshLib::Face>::operator*((TreeIterator<MeshLib::Face> *)local_260);
    piVar13 = Face::id(pFVar14);
    if (*piVar13 < nv._4_4_) {
      local_3b4 = nv._4_4_;
    }
    else {
      pFVar14 = AVL::TreeIterator<MeshLib::Face>::operator*
                          ((TreeIterator<MeshLib::Face> *)local_260);
      piVar13 = Face::id(pFVar14);
      local_3b4 = *piVar13;
    }
    nv._4_4_ = local_3b4;
    AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)local_260);
  }
  this_00 = createVertex(this,local_134 + 1);
  ppHVar8 = Edge::halfedge((Edge *)viter.m_root,0);
  new_faces._8_8_ = *ppHVar8;
  ppHVar8 = Edge::halfedge((Edge *)viter.m_root,1);
  pHVar2 = *ppHVar8;
  pbVar9 = Vertex::boundary(this_00);
  *pbVar9 = pHVar2 == (HalfEdge *)0x0;
  AVL::Tree<MeshLib::Edge>::remove(&this->m_edges,(char *)viter.m_root);
  List<MeshLib::Face>::List((List<MeshLib::Face> *)local_298);
  for (v[2]._4_4_ = 0; v[2]._4_4_ < 2; v[2]._4_4_ = v[2]._4_4_ + 1) {
    f = (tFace)hes[(long)v[2]._4_4_ + -1];
    if (f != (tFace)0x0) {
      ppFVar10 = HalfEdge::face((HalfEdge *)f);
      pFVar14 = *ppFVar10;
      AVL::Tree<MeshLib::Face>::remove(&this->m_faces,(char *)pFVar14);
      if (pFVar14 != (Face *)0x0) {
        Face::~Face(pFVar14);
        operator_delete(pFVar14);
      }
      for (te._4_4_ = 0; te._4_4_ < 3; te._4_4_ = te._4_4_ + 1) {
        ppVVar11 = HalfEdge::target((HalfEdge *)f);
        v[(long)te._4_4_ + -1] = *ppVVar11;
        ppEVar12 = HalfEdge::edge((HalfEdge *)f);
        pEVar3 = *ppEVar12;
        ppHVar8 = Edge::halfedge(pEVar3,0);
        if ((tFace)*ppHVar8 == f) {
          ppHVar8 = Edge::halfedge(pEVar3,1);
          pHVar2 = *ppHVar8;
          ppHVar8 = Edge::halfedge(pEVar3,0);
          *ppHVar8 = pHVar2;
        }
        ppHVar8 = Edge::halfedge(pEVar3,1);
        *ppHVar8 = (HalfEdge *)0x0;
        ppHVar8 = HalfEdge::he_next((HalfEdge *)f);
        f = (tFace)*ppHVar8;
      }
      for (ne._4_4_ = 0; ne._4_4_ < 3; ne._4_4_ = ne._4_4_ + 1) {
        ppHVar8 = HalfEdge::he_next((HalfEdge *)f);
        vid._4_8_ = *ppHVar8;
        if (f != (tFace)0x0) {
          HalfEdge::~HalfEdge((HalfEdge *)f);
          operator_delete(f);
        }
        f = (tFace)vid._4_8_;
      }
      w[1] = v[0];
      for (ne._4_4_ = 0; ne._4_4_ < 3; ne._4_4_ = ne._4_4_ + 1) {
        piVar13 = Vertex::id(w[(long)ne._4_4_ + -1]);
        vid[(long)ne._4_4_ + -2] = *piVar13;
      }
      iter.m_list = (List<MeshLib::Face> *)createFace(this,local_2f4,nv._4_4_ + 1);
      List<MeshLib::Face>::Append((List<MeshLib::Face> *)local_298,(Face *)iter.m_list);
      w[0] = v[0];
      w[1] = v[1];
      for (ne._4_4_ = 0; ne._4_4_ < 3; ne._4_4_ = ne._4_4_ + 1) {
        piVar13 = Vertex::id(w[(long)ne._4_4_ + -1]);
        vid[(long)ne._4_4_ + -2] = *piVar13;
      }
      nv._4_4_ = nv._4_4_ + 2;
      iter.m_list = (List<MeshLib::Face> *)createFace(this,local_2f4,nv._4_4_);
      List<MeshLib::Face>::Append((List<MeshLib::Face> *)local_298,(Face *)iter.m_list);
    }
  }
  ListIterator<MeshLib::Face>::ListIterator
            ((ListIterator<MeshLib::Face> *)&f_1,(List<MeshLib::Face> *)local_298);
  while (bVar6 = ListIterator<MeshLib::Face>::end((ListIterator<MeshLib::Face> *)&f_1),
        ((bVar6 ^ 0xffU) & 1) != 0) {
    pFVar14 = ListIterator<MeshLib::Face>::operator*((ListIterator<MeshLib::Face> *)&f_1);
    ppHVar8 = Face::halfedge(pFVar14);
    e_1 = (Edge *)*ppHVar8;
    do {
      ppEVar12 = HalfEdge::edge((HalfEdge *)e_1);
      pEVar3 = *ppEVar12;
      ppHVar8 = Edge::halfedge(pEVar3,1);
      if (*ppHVar8 != (HalfEdge *)0x0) {
        ppHVar8 = Edge::halfedge(pEVar3,0);
        pHVar2 = *ppHVar8;
        ppVVar11 = HalfEdge::target(pHVar2);
        piVar13 = Vertex::id(*ppVVar11);
        iVar1 = *piVar13;
        ppVVar11 = HalfEdge::source(pHVar2);
        piVar13 = Vertex::id(*ppVVar11);
        if (iVar1 < *piVar13) {
          ppHVar8 = Edge::halfedge(pEVar3,1);
          pHVar4 = *ppHVar8;
          ppHVar8 = Edge::halfedge(pEVar3,0);
          *ppHVar8 = pHVar4;
          ppHVar8 = Edge::halfedge(pEVar3,1);
          *ppHVar8 = pHVar2;
        }
      }
      ppHVar8 = HalfEdge::he_next((HalfEdge *)e_1);
      e_1 = (Edge *)*ppHVar8;
      ppHVar8 = Face::halfedge(pFVar14);
    } while (e_1 != (Edge *)*ppHVar8);
    ListIterator<MeshLib::Face>::operator++((ListIterator<MeshLib::Face> *)&f_1);
  }
  ListIterator<MeshLib::Face>::~ListIterator((ListIterator<MeshLib::Face> *)&f_1);
  pNVar5 = viter.m_root;
  if (viter.m_root != (Node<MeshLib::Vertex> *)0x0) {
    Edge::~Edge((Edge *)viter.m_root);
    operator_delete(pNVar5);
  }
  List<MeshLib::Face>::~List((List<MeshLib::Face> *)local_298);
  AVL::TreeIterator<MeshLib::Face>::~TreeIterator((TreeIterator<MeshLib::Face> *)local_260);
  AVL::TreeIterator<MeshLib::Vertex>::~TreeIterator((TreeIterator<MeshLib::Vertex> *)local_130);
  return this_00;
}

Assistant:

Vertex * Solid::edgeSplit( Edge * e )
{
	//find the max_id for vertices;

	AVL::TreeIterator<Vertex> viter(m_verts);

	int max_vid = -1;

	for( ; !viter.end(); ++viter )
	{
		max_vid = ( max_vid > (*viter)->id() )? max_vid: (*viter)->id();
	}

	AVL::TreeIterator<Face> fiter(m_faces);

	int max_fid = -1;

	for( ; !fiter.end(); ++fiter )
	{
		max_fid = ( max_fid > (*fiter)->id() )? max_fid: (*fiter)->id();
	}

	//create a new vertex

	tVertex nv = createVertex( ++max_vid );

	tHalfEdge hes[2];
	hes[0] = e->halfedge(0);
	hes[1] = e->halfedge(1);

	nv->boundary() = (hes[1]==NULL);

	m_edges.remove( e );


	List<Face> new_faces;

	for( int j = 0; j < 2; j ++ )
	{
		tVertex v[3];
		tHalfEdge he = hes[j];

		if( he == NULL ) continue;

		tFace  f = he->face();
		m_faces.remove( f );
		delete f;

		for( int i = 0; i < 3; i ++ )
		{
			v[i] = he->target();
			
			tEdge te = he->edge();
			if( te->halfedge(0) == he )
			{
				te->halfedge(0) = te->halfedge(1);
			}
			te->halfedge(1) = NULL;

			he = he->he_next();
		}

		int k;
		for( k = 0; k < 3; k ++ )
		{
			tHalfEdge ne = he->he_next();
			delete he;
			he = ne;
		}

		int vid[3];
		tVertex w[3];
		w[0] = nv; w[1] = v[0]; w[2] = v[1];
		for( k = 0; k < 3; k ++ )
		{
			vid[k] = w[k]->id(); 
		}		

		Face * nf = createFace( vid, ++max_fid );
		new_faces.Append( nf );

		w[0] = nv; w[1] = v[1]; w[2] = v[2];
		for( k = 0; k < 3; k ++ )
		{
			vid[k] = w[k]->id(); 
		}	
		nf = createFace( vid, ++ max_fid );
		new_faces.Append( nf );
	}	


	for( ListIterator<Face> iter( new_faces ); !iter.end(); ++ iter )
	{
		Face * f = *iter;
		HalfEdge * he = f->halfedge();

		do{
			Edge     * e = he->edge();
			if( e->halfedge(1) != NULL )
			{
				HalfEdge * h = e->halfedge(0);
				if( h->target()->id() < h->source()->id() )
				{
					e->halfedge(0) = e->halfedge(1);
					e->halfedge(1) = h;
				}
			}
			he = he->he_next();
		}while( he != f->halfedge() );
	}

	delete e;
	return nv;	
}